

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_simplify.c
# Opt level: O0

lua_Number numarith(CompilerState *compiler_state,int op,lua_Number v1,lua_Number v2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  lua_Number v2_local;
  lua_Number v1_local;
  int op_local;
  CompilerState *compiler_state_local;
  
  switch(op) {
  case 0:
    compiler_state_local = (CompilerState *)(v1 + v2);
    break;
  case 1:
    compiler_state_local = (CompilerState *)(v1 - v2);
    break;
  case 2:
    compiler_state_local = (CompilerState *)(v1 * v2);
    break;
  case 3:
    compiler_state_local = (CompilerState *)luaV_modf(v1,v2);
    break;
  case 4:
    compiler_state_local = (CompilerState *)pow(v1,v2);
    break;
  case 5:
    compiler_state_local = (CompilerState *)(v1 / v2);
    break;
  case 6:
    auVar1._8_8_ = 0;
    auVar1._0_8_ = v1;
    auVar2._0_8_ = v1 / v2;
    auVar2._8_8_ = 0;
    auVar1 = vroundsd_avx(auVar1,auVar2,9);
    compiler_state_local = auVar1._0_8_;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_simplify.c"
                  ,0x123,"lua_Number numarith(CompilerState *, int, lua_Number, lua_Number)");
  case 0x16:
    compiler_state_local = (CompilerState *)((ulong)v1 ^ 0x8000000000000000);
  }
  return (lua_Number)compiler_state_local;
}

Assistant:

static lua_Number numarith(CompilerState *compiler_state, int op, lua_Number v1, lua_Number v2)
{
	switch (op) {
	case BINOPR_ADD:
		return luai_numadd(v1, v2);
	case BINOPR_SUB:
		return luai_numsub(v1, v2);
	case BINOPR_MUL:
		return luai_nummul(v1, v2);
	case BINOPR_DIV:
		return luai_numdiv(v1, v2);
	case BINOPR_POW:
		return luai_numpow(v1, v2);
	case BINOPR_IDIV:
		return luai_numidiv(v1, v2);
	case UNOPR_MINUS:
		return luai_numunm(v1);
	case BINOPR_MOD:
		return luaV_modf(v1, v2);
	default:
		assert(0);
		return 0;
	}
}